

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVarLengthArray<QRhiPassResourceTracker,_8LL>::~QVarLengthArray
          (QVarLengthArray<QRhiPassResourceTracker,_8LL> *this)

{
  undefined1 *puVar1;
  
  std::_Destroy_n_aux<false>::__destroy_n<QRhiPassResourceTracker*,long_long>
            ((QRhiPassResourceTracker *)
             (this->super_QVLABase<QRhiPassResourceTracker>).super_QVLABaseBase.ptr,
             (this->super_QVLABase<QRhiPassResourceTracker>).super_QVLABaseBase.s);
  puVar1 = (undefined1 *)(this->super_QVLABase<QRhiPassResourceTracker>).super_QVLABaseBase.ptr;
  if ((QVLAStorage<16UL,_8UL,_8LL> *)puVar1 != &this->super_QVLAStorage<16UL,_8UL,_8LL>) {
    QtPrivate::sizedFree
              (puVar1,(this->super_QVLABase<QRhiPassResourceTracker>).super_QVLABaseBase.a << 4);
    return;
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }